

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayKernel.hh
# Opt level: O2

bool __thiscall OpenMesh::PolyConnectivity::is_boundary(PolyConnectivity *this,VertexHandle _vh)

{
  uint uVar1;
  
  uVar1 = *(uint *)(*(long *)&this->field_0xc8 + (long)(int)_vh.super_BaseHandle.idx_ * 4);
  if (-1 < (int)uVar1) {
    return SUB41((uint)*(undefined4 *)
                        ((ulong)((uVar1 & 1) << 4) +
                        (ulong)(uVar1 >> 1) * 0x20 + *(long *)&this->field_0xe0) >> 0x1f,0);
  }
  return true;
}

Assistant:

const Vertex& vertex(VertexHandle _vh) const
  {
    assert(is_valid_handle(_vh));
    return vertices_[_vh.idx()];
  }